

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_221797::BIP32PubkeyProvider::GetPubKey
          (BIP32PubkeyProvider *this,int pos,SigningProvider *arg,CPubKey *key_out,
          KeyOriginInfo *final_info_out,DescriptorCache *read_cache,DescriptorCache *write_cache)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  bool bVar4;
  bool bVar5;
  DeriveType DVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  undefined4 *puVar10;
  undefined4 *puVar11;
  CExtPubKey *pCVar12;
  CExtPubKey *pCVar13;
  const_iterator __begin4;
  uint *puVar14;
  long in_FS_OFFSET;
  byte bVar15;
  KeyOriginInfo final_info_out_tmp;
  KeyOriginInfo parent_info;
  CExtPubKey local_29c;
  CExtKey lh_xprv;
  CExtKey xprv;
  CExtPubKey last_hardened_extkey;
  CExtPubKey parent_extkey;
  CExtPubKey final_extkey;
  CKeyID keyid;
  
  bVar15 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  parent_info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parent_info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parent_info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CPubKey::GetID(&keyid,(CPubKey *)&this->field_0x3c);
  parent_info.fingerprint[0] = keyid.super_uint160.super_base_blob<160U>.m_data._M_elems[0];
  parent_info.fingerprint[1] = keyid.super_uint160.super_base_blob<160U>.m_data._M_elems[1];
  parent_info.fingerprint[2] = keyid.super_uint160.super_base_blob<160U>.m_data._M_elems[2];
  parent_info.fingerprint[3] = keyid.super_uint160.super_base_blob<160U>.m_data._M_elems[3];
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&parent_info.path,&this->m_path);
  KeyOriginInfo::KeyOriginInfo(&final_info_out_tmp,&parent_info);
  DVar6 = this->m_derive;
  if (DVar6 == UNHARDENED) {
    final_extkey.version = (uchar  [4])pos;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&final_info_out_tmp.path,(uint *)&final_extkey);
    DVar6 = this->m_derive;
  }
  if (DVar6 == HARDENED) {
    final_extkey.version = (uchar  [4])(pos | 0x80000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&final_info_out_tmp.path,(uint *)&final_extkey);
  }
  puVar11 = (undefined4 *)&(this->super_PubkeyProvider).field_0xc;
  lVar9 = 0x1d;
  puVar10 = puVar11;
  pCVar12 = &final_extkey;
  for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined4 *)pCVar12->version = *puVar10;
    puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
    pCVar12 = (CExtPubKey *)((long)pCVar12 + (ulong)bVar15 * -8 + 4);
  }
  pCVar12 = &parent_extkey;
  for (; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(undefined4 *)pCVar12->version = *puVar11;
    puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
    pCVar12 = (CExtPubKey *)((long)pCVar12 + (ulong)bVar15 * -8 + 4);
  }
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  last_hardened_extkey.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  last_hardened_extkey.pubkey.vch[0] = 0xff;
  if (read_cache == (DescriptorCache *)0x0) {
    if (this->m_derive != HARDENED) {
      puVar14 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar7 = puVar14;
      do {
        if (puVar7 == puVar3) {
          goto LAB_00159809;
        }
        uVar1 = *puVar7;
        puVar7 = puVar7 + 1;
      } while (-1 < (int)uVar1);
    }
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    xprv.key.fCompressed = false;
    xprv.key.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )0x0;
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    lh_xprv.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    lh_xprv.key.fCompressed = false;
    lh_xprv.key.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )0x0;
    bVar5 = GetDerivedExtKey(this,arg,&xprv,&lh_xprv);
    bVar4 = true;
    if (bVar5) {
      CExtKey::Neuter(&local_29c,&xprv);
      pCVar12 = &local_29c;
      pCVar13 = &parent_extkey;
      for (lVar9 = 0x71; lVar9 != 0; lVar9 = lVar9 + -1) {
        pCVar13->version[0] = pCVar12->version[0];
        pCVar12 = (CExtPubKey *)((long)pCVar12 + (ulong)bVar15 * -2 + 1);
        pCVar13 = (CExtPubKey *)((long)pCVar13 + (ulong)bVar15 * -2 + 1);
      }
      DVar6 = this->m_derive;
      bVar4 = true;
      if (DVar6 == UNHARDENED) {
        bVar4 = CExtKey::Derive(&xprv,&xprv,pos);
        DVar6 = this->m_derive;
      }
      if (DVar6 == HARDENED) {
        bVar4 = CExtKey::Derive(&xprv,&xprv,pos | 0x80000000);
      }
      CExtKey::Neuter(&local_29c,&xprv);
      pCVar12 = &local_29c;
      pCVar13 = &final_extkey;
      for (lVar9 = 0x71; lVar9 != 0; lVar9 = lVar9 + -1) {
        pCVar13->version[0] = pCVar12->version[0];
        pCVar12 = (CExtPubKey *)((long)pCVar12 + (ulong)bVar15 * -2 + 1);
        pCVar13 = (CExtPubKey *)((long)pCVar13 + (ulong)bVar15 * -2 + 1);
      }
      if ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           )lh_xprv.key.keydata._M_t.
            super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           )0x0) {
        CExtKey::Neuter(&local_29c,&lh_xprv);
        pCVar12 = &local_29c;
        pCVar13 = &last_hardened_extkey;
        for (lVar9 = 0x71; lVar9 != 0; lVar9 = lVar9 + -1) {
          pCVar13->version[0] = pCVar12->version[0];
          pCVar12 = (CExtPubKey *)((long)pCVar12 + (ulong)bVar15 * -2 + 1);
          pCVar13 = (CExtPubKey *)((long)pCVar13 + (ulong)bVar15 * -2 + 1);
        }
      }
    }
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&lh_xprv.key.keydata);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&xprv.key.keydata);
    if (bVar5) {
LAB_00159882:
      if (bVar4 != false) goto LAB_00159886;
    }
LAB_001598ea:
    bVar4 = false;
  }
  else {
    bVar4 = DescriptorCache::GetCachedDerivedExtPubKey
                      (read_cache,(this->super_PubkeyProvider).m_expr_index,pos,&final_extkey);
    if (!bVar4) {
      if ((this->m_derive == HARDENED) ||
         (bVar4 = DescriptorCache::GetCachedParentExtPubKey
                            (read_cache,(this->super_PubkeyProvider).m_expr_index,&parent_extkey),
         !bVar4)) goto LAB_001598ea;
      pCVar12 = &parent_extkey;
      pCVar13 = &final_extkey;
      for (lVar9 = 0x71; lVar9 != 0; lVar9 = lVar9 + -1) {
        pCVar13->version[0] = pCVar12->version[0];
        pCVar12 = (CExtPubKey *)((long)pCVar12 + (ulong)bVar15 * -2 + 1);
        pCVar13 = (CExtPubKey *)((long)pCVar13 + (ulong)bVar15 * -2 + 1);
      }
      if (this->m_derive == UNHARDENED) {
        bVar4 = CExtPubKey::Derive(&parent_extkey,&final_extkey,pos);
        goto LAB_00159882;
      }
    }
LAB_00159886:
    KeyOriginInfo::operator=(final_info_out,&final_info_out_tmp);
    memcpy(key_out,&final_extkey.pubkey,0x41);
    bVar4 = true;
    if (write_cache != (DescriptorCache *)0x0) {
      if (this->m_derive == HARDENED) {
        if ((final_info_out->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (final_info_out->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          DescriptorCache::CacheDerivedExtPubKey
                    (write_cache,(this->super_PubkeyProvider).m_expr_index,pos,&final_extkey);
        }
      }
      else {
        DescriptorCache::CacheParentExtPubKey
                  (write_cache,(this->super_PubkeyProvider).m_expr_index,&parent_extkey);
        if (((last_hardened_extkey.pubkey.vch[0] & 0xfe) == 2) ||
           ((last_hardened_extkey.pubkey.vch[0] < 8 &&
            ((0xd0U >> (last_hardened_extkey.pubkey.vch[0] & 0x1f) & 1) != 0)))) {
          DescriptorCache::CacheLastHardenedExtPubKey
                    (write_cache,(this->super_PubkeyProvider).m_expr_index,&last_hardened_extkey);
        }
      }
    }
  }
LAB_00159937:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&final_info_out_tmp.path.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&parent_info.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar4;
LAB_00159809:
  if (puVar14 != puVar3) goto code_r0x0015980e;
  pCVar12 = &parent_extkey;
  pCVar13 = &final_extkey;
  for (lVar9 = 0x71; lVar9 != 0; lVar9 = lVar9 + -1) {
    pCVar13->version[0] = pCVar12->version[0];
    pCVar12 = (CExtPubKey *)((long)pCVar12 + (ulong)bVar15 * -2 + 1);
    pCVar13 = (CExtPubKey *)((long)pCVar13 + (ulong)bVar15 * -2 + 1);
  }
  DVar6 = this->m_derive;
  bVar4 = true;
  if (DVar6 == UNHARDENED) {
    bVar4 = CExtPubKey::Derive(&parent_extkey,&final_extkey,pos);
    DVar6 = this->m_derive;
  }
  if (DVar6 == HARDENED) {
    __assert_fail("m_derive != DeriveType::HARDENED",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                  ,0x1bf,
                  "virtual bool (anonymous namespace)::BIP32PubkeyProvider::GetPubKey(int, const SigningProvider &, CPubKey &, KeyOriginInfo &, const DescriptorCache *, DescriptorCache *) const"
                 );
  }
  goto LAB_00159882;
code_r0x0015980e:
  bVar4 = CExtPubKey::Derive(&parent_extkey,&parent_extkey,*puVar14);
  puVar14 = puVar14 + 1;
  if (!bVar4) goto code_r0x00159825;
  goto LAB_00159809;
code_r0x00159825:
  bVar4 = false;
  goto LAB_00159937;
}

Assistant:

bool GetPubKey(int pos, const SigningProvider& arg, CPubKey& key_out, KeyOriginInfo& final_info_out, const DescriptorCache* read_cache = nullptr, DescriptorCache* write_cache = nullptr) const override
    {
        // Info of parent of the to be derived pubkey
        KeyOriginInfo parent_info;
        CKeyID keyid = m_root_extkey.pubkey.GetID();
        std::copy(keyid.begin(), keyid.begin() + sizeof(parent_info.fingerprint), parent_info.fingerprint);
        parent_info.path = m_path;

        // Info of the derived key itself which is copied out upon successful completion
        KeyOriginInfo final_info_out_tmp = parent_info;
        if (m_derive == DeriveType::UNHARDENED) final_info_out_tmp.path.push_back((uint32_t)pos);
        if (m_derive == DeriveType::HARDENED) final_info_out_tmp.path.push_back(((uint32_t)pos) | 0x80000000L);

        // Derive keys or fetch them from cache
        CExtPubKey final_extkey = m_root_extkey;
        CExtPubKey parent_extkey = m_root_extkey;
        CExtPubKey last_hardened_extkey;
        bool der = true;
        if (read_cache) {
            if (!read_cache->GetCachedDerivedExtPubKey(m_expr_index, pos, final_extkey)) {
                if (m_derive == DeriveType::HARDENED) return false;
                // Try to get the derivation parent
                if (!read_cache->GetCachedParentExtPubKey(m_expr_index, parent_extkey)) return false;
                final_extkey = parent_extkey;
                if (m_derive == DeriveType::UNHARDENED) der = parent_extkey.Derive(final_extkey, pos);
            }
        } else if (IsHardened()) {
            CExtKey xprv;
            CExtKey lh_xprv;
            if (!GetDerivedExtKey(arg, xprv, lh_xprv)) return false;
            parent_extkey = xprv.Neuter();
            if (m_derive == DeriveType::UNHARDENED) der = xprv.Derive(xprv, pos);
            if (m_derive == DeriveType::HARDENED) der = xprv.Derive(xprv, pos | 0x80000000UL);
            final_extkey = xprv.Neuter();
            if (lh_xprv.key.IsValid()) {
                last_hardened_extkey = lh_xprv.Neuter();
            }
        } else {
            for (auto entry : m_path) {
                if (!parent_extkey.Derive(parent_extkey, entry)) return false;
            }
            final_extkey = parent_extkey;
            if (m_derive == DeriveType::UNHARDENED) der = parent_extkey.Derive(final_extkey, pos);
            assert(m_derive != DeriveType::HARDENED);
        }
        if (!der) return false;

        final_info_out = final_info_out_tmp;
        key_out = final_extkey.pubkey;

        if (write_cache) {
            // Only cache parent if there is any unhardened derivation
            if (m_derive != DeriveType::HARDENED) {
                write_cache->CacheParentExtPubKey(m_expr_index, parent_extkey);
                // Cache last hardened xpub if we have it
                if (last_hardened_extkey.pubkey.IsValid()) {
                    write_cache->CacheLastHardenedExtPubKey(m_expr_index, last_hardened_extkey);
                }
            } else if (final_info_out.path.size() > 0) {
                write_cache->CacheDerivedExtPubKey(m_expr_index, pos, final_extkey);
            }
        }

        return true;
    }